

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

shared_ptr<const_iDynTree::XMLDocument> __thiscall iDynTree::XMLParser::document(XMLParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<const_iDynTree::XMLDocument> sVar1;
  
  std::__shared_ptr<iDynTree::XMLDocument_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<iDynTree::XMLDocument,void>
            ((__shared_ptr<iDynTree::XMLDocument_const,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2> *)(*in_RSI + 0x170));
  sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_iDynTree::XMLDocument>)
         sVar1.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const XMLDocument> XMLParser::document() const
    {
        assert(m_pimpl);
        return m_pimpl->m_document;
    }